

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O3

idx_t __thiscall
duckdb::BatchTaskManager<duckdb::BatchCopyTask>::TaskCount
          (BatchTaskManager<duckdb::BatchCopyTask> *this)

{
  _Map_pointer ppuVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  _Elt_pointer puVar4;
  _Elt_pointer puVar5;
  _Elt_pointer puVar6;
  int iVar7;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 == 0) {
    ppuVar1 = (this->task_queue).c.
              super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppuVar2 = (this->task_queue).c.
              super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    puVar3 = (this->task_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    puVar4 = (this->task_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    puVar5 = (this->task_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    puVar6 = (this->task_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return ((long)puVar3 - (long)puVar6 >> 3) + ((long)puVar4 - (long)puVar5 >> 3) +
           ((((ulong)((long)ppuVar1 - (long)ppuVar2) >> 3) - 1) +
           (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40;
  }
  ::std::__throw_system_error(iVar7);
}

Assistant:

idx_t TaskCount() {
		lock_guard<mutex> l(task_lock);
		return task_queue.size();
	}